

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  Descriptor *pDVar3;
  undefined4 extraout_var;
  MessageLite *pMVar4;
  Nonnull<const_char_*> pcVar5;
  undefined4 extraout_var_00;
  
  pEVar2 = FindOrNull(this,descriptor->number_);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar2->is_repeated == true) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (3,1,
                        "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                       );
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar2->type * 4) == 10) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                          (ulong)pEVar2->type * 4),10,
                          "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    }
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      pMVar4 = (MessageLite *)(pEVar2->field_0).int64_t_value;
      if ((pEVar2->field_0xa & 4) != 0) {
        pDVar3 = FieldDescriptor::message_type(descriptor);
        iVar1 = (*factory->_vptr_MessageFactory[2])(factory,pDVar3);
        iVar1 = (*pMVar4->_vptr_MessageLite[9])(pMVar4,CONCAT44(extraout_var,iVar1),this->arena_);
        pMVar4 = (MessageLite *)CONCAT44(extraout_var_00,iVar1);
        if ((this->arena_ == (Arena *)0x0) &&
           ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0)) {
          (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
        }
      }
      Erase(this,descriptor->number_);
      return pMVar4;
    }
  }
  else {
    UnsafeArenaReleaseMessage();
  }
  UnsafeArenaReleaseMessage();
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    const FieldDescriptor* descriptor, MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->ptr.lazymessage_value->UnsafeArenaReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
      if (arena_ == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      ret = extension->ptr.message_value;
    }
    Erase(descriptor->number());
    return ret;
  }
}